

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O1

void __thiscall gdsNODE::reset(gdsNODE *this)

{
  pointer piVar1;
  
  this->plex = 0;
  this->layer = 0;
  this->nodetype = 0;
  piVar1 = (this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  piVar1 = (this->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  this->propattr = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->propvalue,0,(char *)(this->propvalue)._M_string_length,0x1763d5);
  return;
}

Assistant:

void gdsNODE::reset()
{
  plex = 0; // optional
  layer = 0;
  nodetype = 0;
  // A maximum of 50 coordinates
  xCor.clear();
  yCor.clear();
  propattr = 0;
  propvalue = "\0";
}